

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool DynamicProfileStorage::Initialize(void)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  
  if (initialized) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,299,"(!initialized)","Initialize called multiple times");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = true;
  if (initialized == false) {
    initialized = true;
    bVar2 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileCacheDirFlag);
    bVar3 = true;
    if (bVar2) {
      enabled = true;
      collectInfo = true;
      bVar3 = SetupCacheDir(DAT_015b01b0);
    }
    bVar4 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileInputFlag);
    bVar2 = bVar3;
    if (bVar4) {
      enabled = true;
      ClearCacheCatalog();
      if (DAT_015b01b8 != (char16 *)0x0) {
        bVar4 = true;
        if (collectInfo == false) {
          bVar4 = Js::ConfigFlagsTable::IsEnabled
                            ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileCacheFlag)
          ;
        }
        uVar7 = 1;
        collectInfo = bVar4;
        do {
          bVar4 = ImportFile(DAT_015b01b8,false);
          if (bVar4) {
            return bVar3;
          }
          Sleep(100);
          if (DAT_015d346a == '\x01') {
            Output::Print(L"  Retrying load of dynamic profile from \'%s\' (attempt %d)...\n",
                          DAT_015b01b8,uVar7);
            Output::Flush();
          }
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
        } while (uVar6 != 0x15);
        if (bVar4) {
          return bVar3;
        }
      }
      collectInfo = true;
    }
    else {
      bVar4 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileCacheFlag);
      if (bVar4) {
        enabled = true;
        collectInfo = true;
        if (DAT_015b01a0 != (char16 *)0x0) {
          bVar4 = ImportFile(DAT_015b01a0,true);
          bVar2 = false;
          if (bVar4) {
            bVar2 = bVar3;
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::Initialize()
{
    AssertOrFailFastMsg(!initialized, "Initialize called multiple times");
    if (initialized)
    {
        return true;
    }

    bool success = true;
    initialized = true;

#ifdef FORCE_DYNAMIC_PROFILE_STORAGE
    enabled = true;
    collectInfo = true;
    if (!SetupCacheDir(nullptr))
    {
        success = false;
    }

#else
    if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheDirFlag))
    {
        enabled = true;
        collectInfo = true;
        if (!SetupCacheDir(Js::Configuration::Global.flags.DynamicProfileCacheDir))
        {
            success = false;
        }
    }
#endif

    // If -DynamicProfileInput is specified, the file specified in -DynamicProfileCache
    // will not be imported and will be overwritten
    if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileInputFlag))
    {
        enabled = true;
        ClearCacheCatalog();

        // -DynamicProfileInput
        //      Without other -DynamicProfile flags - enable in memory profile cache without exporting
        //      With -DynamicProfileCache           - override the dynamic profile cache file
        //      With -DynamicProfileCacheDir        - clear the dynamic profile cache directory

        if (Js::Configuration::Global.flags.DynamicProfileInput != nullptr)
        {
            // Error if we can't in the profile info if we are not using a cache file or directory.
            collectInfo = collectInfo || Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheFlag);

            // Try to open the DynamicProfileInput.
            // If failure to open, retry at 100 ms intervals until a timeout.

            const uint32 MAX_DELAY = 2000;  // delay at most 2 seconds
            const uint32 DELAY_INTERVAL = 100;
            const uint32 MAX_TRIES = MAX_DELAY / DELAY_INTERVAL;
            bool readSuccessful = false;

            for (uint32 i = 0; i < MAX_TRIES; i++)
            {
                readSuccessful = ImportFile(Js::Configuration::Global.flags.DynamicProfileInput, false);
                if (readSuccessful)
                {
                    break;
                }

                Sleep(DELAY_INTERVAL);
                if (Js::Configuration::Global.flags.Verbose)
                {
                    Output::Print(_u("  Retrying load of dynamic profile from '%s' (attempt %d)...\n"),
                        (char16 const *)Js::Configuration::Global.flags.DynamicProfileInput, i + 1);
                    Output::Flush();
                }
            }

            if (!readSuccessful)
            {
                // If file cannot be read, behave as if DynamicProfileInput == null.
                collectInfo = true;
            }
        }
        else
        {
            // Don't error if we can't find the profile info
            collectInfo = true;
        }
    }
    else if (Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileCacheFlag))
    {
        enabled = true;
        collectInfo = true;
        if (Js::Configuration::Global.flags.DynamicProfileCache)
        {
            if (!ImportFile(Js::Configuration::Global.flags.DynamicProfileCache, true))
            {
                success = false;
            }
        }
    }

    return success;
}